

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ConeRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ConeRecord2 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,(EnvironmentRecord *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tVertex Location:  ",0x13);
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&(this->super_ConeRecord1).m_Loc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation:      ",0x13);
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&(this->super_ConeRecord1).m_Ori);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tVelocity:         ",0x13);
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_Velocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tAngular Velocity: ",0x13);
  Vector::GetAsString_abi_cxx11_(&local_240,&this->m_AngularVelocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tHeight:           ",0x13);
  poVar1 = std::ostream::_M_insert<double>((double)(float)(this->super_ConeRecord1).m_f32Height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\td(Height)/dt:     ",0x13);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32ddtHeight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tPeak Angle:       ",0x13);
  poVar1 = std::ostream::_M_insert<double>((double)(float)(this->super_ConeRecord1).m_f32PeakAngle);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\td(Peak Angle)/dt: ",0x13);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32ddtPeak);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ConeRecord2::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tVertex Location:  " << m_Loc.GetAsString()
       << "\tOrientation:      " << m_Ori.GetAsString()
       << "\tVelocity:         " << m_Velocity.GetAsString()
       << "\tAngular Velocity: " << m_AngularVelocity.GetAsString()
       << "\tHeight:           " << m_f32Height    << "\n"
       << "\td(Height)/dt:     " << m_f32ddtHeight << "\n"
       << "\tPeak Angle:       " << m_f32PeakAngle << "\n"
       << "\td(Peak Angle)/dt: " << m_f32ddtPeak   << "\n";

    return ss.str();
}